

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::Regex::InternalSwap(Regex *this,Regex *other)

{
  bool bVar1;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  string *psVar2;
  Arena *this_01;
  string *psVar3;
  long in_RSI;
  Regex *in_RDI;
  string *other_ptr_1;
  string *this_ptr_1;
  string *other_ptr;
  string *this_ptr;
  UnknownFieldSet *in_stack_fffffffffffffec8;
  ArenaStringPtr *this_02;
  Arena *in_stack_fffffffffffffed0;
  Arena *arena;
  string *in_stack_fffffffffffffed8;
  ArenaStringPtr *in_stack_fffffffffffffee0;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_ffffffffffffff00;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 8);
  if ((((uint)(in_RDI->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 1) || (((uint)*(undefined8 *)this_00 & 1) == 1)) {
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      google::protobuf::internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                (this_00);
    }
    else {
      google::protobuf::internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
      ::mutable_unknown_fields_slow(in_stack_ffffffffffffff00);
    }
    google::protobuf::internal::InternalMetadataWithArena::DoSwap
              ((InternalMetadataWithArena *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  std::swap<unsigned_int>((in_RDI->_has_bits_).has_bits_,(uint *)(in_RSI + 0x10));
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(in_RDI);
  bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&in_RDI->pattern_,psVar2);
  if ((!bVar1) ||
     (bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault
                        ((ArenaStringPtr *)(in_RSI + 0x18),psVar2), !bVar1)) {
    psVar2 = google::protobuf::internal::ArenaStringPtr::Mutable
                       (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        in_stack_fffffffffffffed0);
    google::protobuf::internal::ArenaStringPtr::Mutable
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::__cxx11::string::swap((string *)psVar2);
  }
  this_02 = &in_RDI->replacement_;
  this_01 = (Arena *)(in_RSI + 0x20);
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(in_RDI);
  arena = this_01;
  psVar2 = psVar3;
  bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(this_02,psVar3);
  if ((!bVar1) ||
     (bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault
                        ((ArenaStringPtr *)this_01,psVar3), !bVar1)) {
    psVar3 = google::protobuf::internal::ArenaStringPtr::Mutable(this_02,psVar2,arena);
    google::protobuf::internal::ArenaStringPtr::Mutable(this_02,psVar2,arena);
    std::__cxx11::string::swap((string *)psVar3);
  }
  return;
}

Assistant:

void Regex::InternalSwap(Regex* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  pattern_.Swap(&other->pattern_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  replacement_.Swap(&other->replacement_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
}